

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_parserInternals(void)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  xmlParserCtxtPtr pxVar13;
  undefined8 uVar14;
  xmlNodePtr pxVar15;
  size_t sVar16;
  long lVar17;
  ulong uVar18;
  int *piVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 uVar22;
  int extraout_EDX;
  int extraout_EDX_00;
  undefined4 uVar23;
  undefined8 uVar24;
  int test_ret_19;
  undefined8 *puVar25;
  undefined **ppuVar26;
  int *piVar27;
  uint *puVar28;
  int n_ctxt;
  uint uVar29;
  xmlChar *pxVar30;
  xmlNodePtr in_RSI;
  undefined8 uVar31;
  int *piVar32;
  undefined *puVar33;
  int n_len_1;
  uint uVar34;
  int test_ret;
  int iVar35;
  undefined4 uVar36;
  char *pcVar37;
  uint uVar38;
  undefined4 *puVar39;
  int n_value;
  uint uVar40;
  bool bVar41;
  int test_ret_2;
  int test_ret_1;
  int test_ret_3;
  int test_ret_4;
  int test_ret_6;
  int test_ret_22;
  int test_ret_23;
  int test_ret_24;
  int test_ret_25;
  uint local_80;
  int local_7c;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  
  if (quiet == '\0') {
    puts("Testing parserInternals : 30 of 87 functions ...");
  }
  uVar29 = 0;
  iVar35 = 0;
  do {
    iVar2 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(uVar29,(int)in_RSI);
    uVar14 = inputPop(pxVar13);
    xmlFreeInputStream(uVar14);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in inputPop",(ulong)(uint)(iVar3 - iVar2));
      iVar35 = iVar35 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
    uVar29 = uVar29 + 1;
  } while (uVar29 != 3);
  function_tests = function_tests + 1;
  local_7c = 0;
  iVar2 = 0;
  do {
    iVar4 = (int)in_RSI;
    iVar3 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(iVar2,iVar4);
    in_RSI = (xmlNodePtr)0x0;
    inputPush(pxVar13);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in inputPush",(ulong)(uint)(iVar4 - iVar3));
      local_7c = local_7c + 1;
      printf(" %d");
      in_RSI = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 3);
  function_tests = function_tests + 1;
  uVar29 = 0;
  local_80 = 0;
  do {
    iVar2 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(uVar29,(int)in_RSI);
    namePop(pxVar13);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in namePop",(ulong)(uint)(iVar3 - iVar2));
      local_80 = local_80 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
    uVar29 = uVar29 + 1;
  } while (uVar29 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar29 = 0;
  do {
    puVar25 = &DAT_00162d68;
    pxVar15 = (xmlNodePtr)0x0;
    do {
      iVar4 = (int)in_RSI;
      iVar3 = xmlMemBlocks();
      pxVar13 = gen_xmlParserCtxtPtr(uVar29,iVar4);
      uVar40 = (uint)pxVar15;
      if (uVar40 < 4) {
        in_RSI = (xmlNodePtr)*puVar25;
      }
      else {
        in_RSI = (xmlNodePtr)0x0;
      }
      namePush(pxVar13);
      call_tests = call_tests + 1;
      if (pxVar13 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar13);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in namePush",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar29);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar15;
      }
      uVar40 = uVar40 + 1;
      pxVar15 = (xmlNodePtr)(ulong)uVar40;
      puVar25 = puVar25 + 1;
    } while (uVar40 != 5);
    uVar29 = uVar29 + 1;
  } while (uVar29 != 3);
  function_tests = function_tests + 1;
  uVar29 = 0;
  iVar3 = 0;
  do {
    iVar4 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(uVar29,(int)in_RSI);
    pxVar15 = (xmlNodePtr)nodePop(pxVar13);
    desret_xmlNodePtr(pxVar15);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in nodePop",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
    uVar29 = uVar29 + 1;
  } while (uVar29 != 3);
  iVar35 = local_7c + iVar35 + local_80;
  function_tests = function_tests + 1;
  local_80 = 0;
  uVar29 = 0;
  do {
    uVar40 = 0;
    do {
      iVar4 = (int)in_RSI;
      iVar5 = xmlMemBlocks();
      pxVar13 = gen_xmlParserCtxtPtr(uVar29,iVar4);
      in_RSI = gen_xmlNodePtr(uVar40,iVar4);
      nodePush(pxVar13,in_RSI);
      call_tests = call_tests + 1;
      iVar4 = extraout_EDX;
      if (pxVar13 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar13);
        iVar4 = extraout_EDX_00;
      }
      des_xmlNodePtr(uVar40,in_RSI,iVar4);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar5 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in nodePush",(ulong)(uint)(iVar4 - iVar5));
        local_80 = local_80 + 1;
        printf(" %d",(ulong)uVar29);
        in_RSI = (xmlNodePtr)(ulong)uVar40;
        printf(" %d");
        putchar(10);
      }
      uVar40 = uVar40 + 1;
    } while (uVar40 != 3);
    uVar29 = uVar29 + 1;
  } while (uVar29 != 3);
  function_tests = function_tests + 1;
  puVar25 = &DAT_00162d68;
  uVar29 = 0;
  iVar4 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (uVar29 < 4) {
      uVar14 = *puVar25;
    }
    else {
      uVar14 = 0;
    }
    xmlCheckLanguageID(uVar14);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCheckLanguageID",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d",(ulong)uVar29);
      putchar(10);
    }
    uVar29 = uVar29 + 1;
    puVar25 = puVar25 + 1;
  } while (uVar29 != 5);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar29 = 0;
  do {
    uVar20 = 0;
    do {
      uVar40 = 0;
      iVar6 = (int)uVar20;
      pxVar30 = (xmlChar *)0x0;
      if (iVar6 == 0) {
        pxVar30 = chartab;
      }
      puVar39 = &DAT_0015fd28;
      do {
        iVar7 = xmlMemBlocks();
        uVar23 = 0xffffffff;
        uVar36 = 0xffffffff;
        if (uVar29 < 4) {
          uVar36 = (&DAT_0015fd28)[uVar29];
        }
        if (uVar40 < 4) {
          uVar23 = *puVar39;
        }
        xmlCopyChar(uVar36,pxVar30,uVar23);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCopyChar",(ulong)(uint)(iVar8 - iVar7));
          iVar5 = iVar5 + 1;
          printf(" %d",(ulong)uVar29);
          printf(" %d",uVar20);
          printf(" %d",(ulong)uVar40);
          putchar(10);
        }
        uVar40 = uVar40 + 1;
        puVar39 = puVar39 + 1;
      } while (uVar40 != 4);
      uVar20 = (ulong)(iVar6 + 1);
    } while (iVar6 == 0);
    uVar29 = uVar29 + 1;
  } while (uVar29 != 4);
  iVar35 = iVar35 + iVar2 + iVar3 + local_80;
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar29 = 0;
  do {
    pxVar30 = (xmlChar *)0x0;
    if (uVar29 == 0) {
      pxVar30 = chartab;
    }
    puVar39 = &DAT_0015fd28;
    uVar20 = 0;
    do {
      iVar3 = xmlMemBlocks();
      uVar36 = 0xffffffff;
      if ((uint)uVar20 < 4) {
        uVar36 = *puVar39;
      }
      xmlCopyCharMultiByte(pxVar30,uVar36);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar3 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyCharMultiByte",(ulong)(uint)(iVar6 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar29);
        printf(" %d",uVar20);
        putchar(10);
      }
      uVar40 = (uint)uVar20 + 1;
      uVar20 = (ulong)uVar40;
      puVar39 = puVar39 + 1;
    } while (uVar40 != 4);
    bVar41 = uVar29 == 0;
    uVar29 = uVar29 + 1;
  } while (bVar41);
  function_tests = function_tests + 1;
  local_80 = 0;
  uVar29 = 0;
  do {
    uVar20 = 0;
    do {
      uVar40 = 0;
      puVar25 = &DAT_00162d68;
      do {
        iVar3 = xmlMemBlocks();
        if (uVar29 < 4) {
          uVar14 = (&DAT_00162d68)[uVar29];
        }
        else {
          uVar14 = 0;
        }
        if ((uint)uVar20 < 4) {
          uVar31 = (&DAT_00162d68)[uVar20];
        }
        else {
          uVar31 = 0;
        }
        if (uVar40 < 4) {
          uVar24 = *puVar25;
        }
        else {
          uVar24 = 0;
        }
        xmlCreateEntityParserCtxt(uVar14,uVar31,uVar24);
        xmlFreeParserCtxt();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar3 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCreateEntityParserCtxt",(ulong)(uint)(iVar6 - iVar3)
                );
          local_80 = local_80 + 1;
          printf(" %d",(ulong)uVar29);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
        }
        uVar40 = uVar40 + 1;
        puVar25 = puVar25 + 1;
      } while (uVar40 != 5);
      uVar40 = (uint)uVar20 + 1;
      uVar20 = (ulong)uVar40;
    } while (uVar40 != 5);
    uVar29 = uVar29 + 1;
  } while (uVar29 != 5);
  function_tests = function_tests + 1;
  ppuVar26 = &PTR_anon_var_dwarf_62f_00162d28;
  uVar29 = 0;
  iVar3 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar29 < 5) {
      puVar33 = *ppuVar26;
    }
    else {
      puVar33 = (undefined *)0x0;
    }
    xmlCreateFileParserCtxt(puVar33);
    xmlFreeParserCtxt();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCreateFileParserCtxt",(ulong)(uint)(iVar7 - iVar6));
      iVar3 = iVar3 + 1;
      printf(" %d",(ulong)uVar29);
      putchar(10);
    }
    uVar29 = uVar29 + 1;
    ppuVar26 = ppuVar26 + 1;
  } while (uVar29 != 6);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar29 = 0;
  do {
    piVar27 = &DAT_0015fd28;
    uVar20 = 0;
    do {
      iVar7 = xmlMemBlocks();
      if (uVar29 == 0) {
        bVar41 = false;
        pcVar37 = "foo";
      }
      else if (uVar29 == 2) {
        bVar41 = false;
        pcVar37 = "test/ent2";
      }
      else if (uVar29 == 1) {
        bVar41 = false;
        pcVar37 = "<foo/>";
      }
      else {
        bVar41 = true;
        pcVar37 = (char *)0x0;
      }
      iVar8 = -1;
      if ((uint)uVar20 < 4) {
        iVar8 = *piVar27;
      }
      if ((bVar41) || (sVar16 = strlen(pcVar37), iVar8 <= (int)sVar16 + 1)) {
        uVar14 = xmlCreateMemoryParserCtxt(pcVar37,iVar8);
        xmlFreeParserCtxt(uVar14);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCreateMemoryParserCtxt",(ulong)(uint)(iVar8 - iVar7)
                );
          iVar6 = iVar6 + 1;
          printf(" %d",(ulong)uVar29);
          printf(" %d",uVar20);
          putchar(10);
        }
      }
      uVar40 = (uint)uVar20 + 1;
      uVar20 = (ulong)uVar40;
      piVar27 = piVar27 + 1;
    } while (uVar40 != 4);
    uVar29 = uVar29 + 1;
  } while (uVar29 != 4);
  function_tests = function_tests + 1;
  iVar35 = iVar35 + iVar4 + iVar5 + iVar2 + local_80;
  local_80 = 0;
  uVar29 = 0;
  do {
    puVar28 = &DAT_0015fd28;
    uVar40 = 0;
    do {
      iVar2 = xmlMemBlocks();
      if (uVar29 < 5) {
        puVar33 = (&PTR_anon_var_dwarf_62f_00162d28)[uVar29];
      }
      else {
        puVar33 = (undefined *)0x0;
      }
      piVar27 = (int *)0xffffffff;
      if (uVar40 < 4) {
        piVar27 = (int *)(ulong)*puVar28;
      }
      xmlCreateURLParserCtxt(puVar33);
      xmlFreeParserCtxt();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar2 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCreateURLParserCtxt",(ulong)(uint)(iVar4 - iVar2));
        local_80 = local_80 + 1;
        printf(" %d",(ulong)uVar29);
        piVar27 = (int *)(ulong)uVar40;
        printf(" %d");
        putchar(10);
      }
      uVar40 = uVar40 + 1;
      puVar28 = puVar28 + 1;
    } while (uVar40 != 4);
    uVar29 = uVar29 + 1;
  } while (uVar29 != 6);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar29 = 0;
  do {
    uVar40 = 0;
    do {
      iVar5 = (int)piVar27;
      iVar4 = xmlMemBlocks();
      pxVar13 = gen_xmlParserCtxtPtr(uVar29,iVar5);
      piVar27 = (int *)0x0;
      if (uVar40 == 0) {
        piVar27 = inttab + 1;
      }
      xmlCurrentChar(pxVar13);
      call_tests = call_tests + 1;
      if (pxVar13 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar13);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCurrentChar",(ulong)(uint)(iVar5 - iVar4));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar29);
        piVar27 = (int *)(ulong)uVar40;
        printf(" %d");
        putchar(10);
      }
      uVar40 = uVar40 + 1;
    } while (uVar40 == 1);
    uVar29 = uVar29 + 1;
  } while (uVar29 != 3);
  function_tests = function_tests + 1;
  puVar39 = &DAT_0015fd28;
  uVar29 = 0;
  iVar4 = 0;
  do {
    iVar5 = xmlMemBlocks();
    uVar36 = 0xffffffff;
    if (uVar29 < 4) {
      uVar36 = *puVar39;
    }
    xmlIsLetter(uVar36);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar5 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIsLetter",(ulong)(uint)(iVar7 - iVar5));
      iVar4 = iVar4 + 1;
      piVar27 = (int *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
    uVar29 = uVar29 + 1;
    puVar39 = puVar39 + 1;
  } while (uVar29 != 4);
  iVar3 = iVar35 + iVar3 + iVar6 + local_80;
  function_tests = function_tests + 1;
  iVar35 = 0;
  iVar5 = 0;
  do {
    iVar7 = (int)piVar27;
    iVar6 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(iVar5,iVar7);
    piVar27 = (int *)0x0;
    uVar14 = xmlNewEntityInputStream(pxVar13);
    xmlFreeInputStream(uVar14);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewEntityInputStream",(ulong)(uint)(iVar7 - iVar6));
      iVar35 = iVar35 + 1;
      printf(" %d");
      piVar27 = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 3);
  function_tests = function_tests + 1;
  local_80 = 0;
  uVar29 = 0;
  do {
    puVar25 = &DAT_00162d88;
    piVar19 = (int *)0x0;
    do {
      iVar6 = (int)piVar27;
      iVar5 = xmlMemBlocks();
      pxVar13 = gen_xmlParserCtxtPtr(uVar29,iVar6);
      uVar40 = (uint)piVar19;
      if (uVar40 < 7) {
        piVar27 = (int *)*puVar25;
      }
      else {
        piVar27 = (int *)0x0;
      }
      uVar14 = xmlNewInputFromFile(pxVar13);
      xmlFreeInputStream(uVar14);
      call_tests = call_tests + 1;
      if (pxVar13 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar13);
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewInputFromFile",(ulong)(uint)(iVar6 - iVar5));
        local_80 = local_80 + 1;
        printf(" %d",(ulong)uVar29);
        printf(" %d");
        putchar(10);
        piVar27 = piVar19;
      }
      uVar40 = uVar40 + 1;
      piVar19 = (int *)(ulong)uVar40;
      puVar25 = puVar25 + 1;
    } while (uVar40 != 8);
    uVar29 = uVar29 + 1;
  } while (uVar29 != 3);
  function_tests = function_tests + 1;
  uVar29 = 0;
  iVar5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(uVar29,(int)piVar27);
    uVar14 = xmlNewInputStream(pxVar13);
    xmlFreeInputStream(uVar14);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewInputStream",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      piVar27 = (int *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
    uVar29 = uVar29 + 1;
  } while (uVar29 != 3);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar29 = 0;
  do {
    puVar25 = &DAT_00162d68;
    piVar19 = (int *)0x0;
    do {
      iVar8 = (int)piVar27;
      iVar7 = xmlMemBlocks();
      pxVar13 = gen_xmlParserCtxtPtr(uVar29,iVar8);
      uVar40 = (uint)piVar19;
      if (uVar40 < 4) {
        piVar27 = (int *)*puVar25;
      }
      else {
        piVar27 = (int *)0x0;
      }
      uVar14 = xmlNewStringInputStream(pxVar13);
      xmlFreeInputStream(uVar14);
      call_tests = call_tests + 1;
      if (pxVar13 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar13);
      }
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewStringInputStream",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar29);
        printf(" %d");
        putchar(10);
        piVar27 = piVar19;
      }
      uVar40 = uVar40 + 1;
      piVar19 = (int *)(ulong)uVar40;
      puVar25 = puVar25 + 1;
    } while (uVar40 != 5);
    uVar29 = uVar29 + 1;
  } while (uVar29 != 3);
  iVar35 = iVar3 + iVar2 + iVar4 + iVar35 + local_80;
  function_tests = function_tests + 1;
  uVar29 = 0;
  iVar2 = 0;
  do {
    iVar3 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(uVar29,(int)piVar27);
    xmlNextChar(pxVar13);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNextChar",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      piVar27 = (int *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
    uVar29 = uVar29 + 1;
  } while (uVar29 != 3);
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlParserInputShrink(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlParserInputShrink");
    piVar27 = (int *)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar29 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(uVar29,(int)piVar27);
    xmlPopInput(pxVar13);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPopInput",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      piVar27 = (int *)(ulong)uVar29;
      printf(" %d");
      putchar(10);
    }
    uVar29 = uVar29 + 1;
  } while (uVar29 != 3);
  function_tests = function_tests + 1;
  local_80 = 0;
  iVar8 = 0;
  do {
    iVar10 = (int)piVar27;
    iVar9 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(iVar8,iVar10);
    piVar27 = (int *)0x0;
    xmlPushInput(pxVar13);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPushInput",(ulong)(uint)(iVar10 - iVar9));
      local_80 = local_80 + 1;
      printf(" %d");
      piVar27 = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 3);
  function_tests = function_tests + 1;
  local_60 = 0;
  uVar29 = 0;
  do {
    puVar25 = &DAT_00162d68;
    uVar40 = 0;
    do {
      iVar9 = (int)piVar27;
      iVar8 = xmlMemBlocks();
      pxVar13 = gen_xmlParserCtxtPtr(uVar29,iVar9);
      if (uVar40 < 4) {
        piVar27 = (int *)*puVar25;
      }
      else {
        piVar27 = (int *)0x0;
      }
      lVar17 = xmlSplitQName(pxVar13,piVar27,0);
      if (lVar17 != 0) {
        (*_xmlFree)(lVar17);
      }
      call_tests = call_tests + 1;
      if (pxVar13 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar13);
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSplitQName",(ulong)(uint)(iVar9 - iVar8));
        local_60 = local_60 + 1;
        printf(" %d",(ulong)uVar29);
        printf(" %d");
        piVar27 = (int *)0x0;
        printf(" %d");
        putchar(10);
      }
      uVar40 = uVar40 + 1;
      puVar25 = puVar25 + 1;
    } while (uVar40 != 5);
    uVar29 = uVar29 + 1;
  } while (uVar29 != 3);
  function_tests = function_tests + 1;
  local_5c = 0;
  uVar29 = 0;
  do {
    uVar40 = 0;
    do {
      piVar19 = (int *)0x0;
      do {
        iVar9 = (int)piVar27;
        iVar8 = xmlMemBlocks();
        pxVar13 = gen_xmlParserCtxtPtr(uVar29,iVar9);
        if (uVar40 < 4) {
          piVar27 = (int *)(&DAT_00162d68)[uVar40];
        }
        else {
          piVar27 = (int *)0x0;
        }
        iVar9 = (int)piVar19;
        uVar14 = 0;
        if (iVar9 == 0) {
          uVar14 = 0x1658d8;
        }
        xmlStringCurrentChar(pxVar13,piVar27,uVar14);
        call_tests = call_tests + 1;
        if (pxVar13 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar13);
        }
        xmlResetLastError();
        iVar10 = xmlMemBlocks();
        if (iVar8 != iVar10) {
          iVar10 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStringCurrentChar",(ulong)(uint)(iVar10 - iVar8));
          local_5c = local_5c + 1;
          printf(" %d",(ulong)uVar29);
          printf(" %d",(ulong)uVar40);
          printf(" %d");
          putchar(10);
          piVar27 = piVar19;
        }
        uVar34 = iVar9 + 1;
        piVar19 = (int *)(ulong)uVar34;
      } while (uVar34 == 1);
      uVar40 = uVar40 + 1;
    } while (uVar40 != 5);
    uVar29 = uVar29 + 1;
  } while (uVar29 != 3);
  function_tests = function_tests + 1;
  iVar35 = iVar35 + iVar5 + iVar6 + iVar2 + (uint)(iVar3 != iVar4) + iVar7 + local_80;
  local_58 = 0;
  local_80 = 0;
  do {
    uVar29 = 0;
    do {
      uVar20 = 0;
      do {
        uVar21 = 0;
        do {
          uVar40 = 0xf82061 >> ((char)uVar21 * '\b' & 0x1fU);
          if (2 < (uint)uVar21) {
            uVar40 = 0;
          }
          uVar18 = 0;
          do {
            uVar22 = (char)(0xf82061 >> ((char)uVar18 * '\b' & 0x1fU));
            if (2 < (uint)uVar18) {
              uVar22 = 0;
            }
            piVar19 = (int *)0x0;
            do {
              iVar3 = (int)piVar27;
              iVar2 = xmlMemBlocks();
              pxVar13 = gen_xmlParserCtxtPtr(local_80,iVar3);
              if (uVar29 < 4) {
                piVar27 = (int *)(&DAT_00162d68)[uVar29];
              }
              else {
                piVar27 = (int *)0x0;
              }
              uVar36 = 0xffffffff;
              if ((uint)uVar20 < 4) {
                uVar36 = (&DAT_0015fd28)[uVar20];
              }
              uVar34 = (uint)piVar19;
              uVar1 = (undefined1)(0xf82061 >> ((char)piVar19 * '\b' & 0x1fU));
              if (2 < uVar34) {
                uVar1 = 0;
              }
              lVar17 = xmlStringDecodeEntities(pxVar13,piVar27,uVar36,uVar40 & 0xff,uVar22,uVar1);
              if (lVar17 != 0) {
                (*_xmlFree)(lVar17);
              }
              call_tests = call_tests + 1;
              if (pxVar13 != (xmlParserCtxtPtr)0x0) {
                xmlFreeParserCtxt(pxVar13);
              }
              xmlResetLastError();
              iVar3 = xmlMemBlocks();
              if (iVar2 != iVar3) {
                iVar3 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlStringDecodeEntities",
                       (ulong)(uint)(iVar3 - iVar2));
                local_58 = local_58 + 1;
                printf(" %d",(ulong)local_80);
                printf(" %d",(ulong)uVar29);
                printf(" %d",uVar20);
                printf(" %d",uVar21);
                printf(" %d",uVar18);
                printf(" %d");
                putchar(10);
                piVar27 = piVar19;
              }
              uVar34 = uVar34 + 1;
              piVar19 = (int *)(ulong)uVar34;
            } while (uVar34 != 4);
            uVar34 = (uint)uVar18 + 1;
            uVar18 = (ulong)uVar34;
          } while (uVar34 != 4);
          uVar40 = (uint)uVar21 + 1;
          uVar21 = (ulong)uVar40;
        } while (uVar40 != 4);
        uVar40 = (uint)uVar20 + 1;
        uVar20 = (ulong)uVar40;
      } while (uVar40 != 4);
      uVar29 = uVar29 + 1;
    } while (uVar29 != 5);
    local_80 = local_80 + 1;
  } while (local_80 != 3);
  function_tests = function_tests + 1;
  local_54 = 0;
  uVar29 = 0;
  do {
    uVar40 = 0;
    do {
      uVar34 = 0;
      do {
        uVar12 = 0;
        do {
          piVar19 = (int *)(ulong)uVar12;
          uVar20 = 0;
          do {
            uVar22 = (undefined1)(0xf82061 >> ((char)uVar20 * '\b' & 0x1fU));
            if (2 < (uint)uVar20) {
              uVar22 = 0;
            }
            uVar21 = 0;
            do {
              uVar1 = (undefined1)(0xf82061 >> ((char)uVar21 * '\b' & 0x1fU));
              piVar32 = (int *)0x0;
              if (2 < (uint)uVar21) {
                uVar1 = 0;
              }
              do {
                iVar3 = (int)piVar27;
                iVar2 = xmlMemBlocks();
                pxVar13 = gen_xmlParserCtxtPtr(uVar29,iVar3);
                switch(uVar40) {
                case 0:
                  bVar41 = false;
                  pcVar37 = "foo";
                  break;
                case 1:
                  bVar41 = false;
                  pcVar37 = "<foo/>";
                  break;
                case 2:
                  bVar41 = false;
                  pcVar37 = anon_var_dwarf_1b8;
                  break;
                case 3:
                  bVar41 = false;
                  pcVar37 = " 2ab ";
                  break;
                default:
                  bVar41 = true;
                  pcVar37 = (char *)0x0;
                }
                uVar36 = 0xffffffff;
                iVar3 = -1;
                if (uVar34 < 4) {
                  iVar3 = (&DAT_0015fd28)[uVar34];
                }
                if (uVar12 < 4) {
                  uVar36 = (&DAT_0015fd28)[(long)piVar19];
                }
                uVar38 = (uint)piVar32;
                uVar11 = 0xf82061 >> ((char)piVar32 * '\b' & 0x1fU);
                if (2 < uVar38) {
                  uVar11 = 0;
                }
                if ((bVar41) ||
                   (piVar27 = piVar19, sVar16 = strlen(pcVar37), iVar3 <= (int)sVar16 + 1)) {
                  lVar17 = xmlStringLenDecodeEntities
                                     (pxVar13,pcVar37,iVar3,uVar36,uVar22,uVar1,uVar11 & 0xff);
                  if (lVar17 != 0) {
                    (*_xmlFree)(lVar17);
                  }
                  call_tests = call_tests + 1;
                  if (pxVar13 != (xmlParserCtxtPtr)0x0) {
                    xmlFreeParserCtxt(pxVar13);
                  }
                  xmlResetLastError();
                  iVar3 = xmlMemBlocks();
                  piVar27 = (int *)pcVar37;
                  if (iVar2 != iVar3) {
                    iVar3 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlStringLenDecodeEntities",
                           (ulong)(uint)(iVar3 - iVar2));
                    local_54 = local_54 + 1;
                    printf(" %d",(ulong)uVar29);
                    printf(" %d",(ulong)uVar40);
                    printf(" %d",(ulong)uVar34);
                    printf(" %d",piVar19);
                    printf(" %d",uVar20);
                    printf(" %d",uVar21);
                    printf(" %d");
                    putchar(10);
                    piVar27 = piVar32;
                  }
                }
                uVar38 = uVar38 + 1;
                piVar32 = (int *)(ulong)uVar38;
              } while (uVar38 != 4);
              uVar11 = (uint)uVar21 + 1;
              uVar21 = (ulong)uVar11;
            } while (uVar11 != 4);
            uVar11 = (uint)uVar20 + 1;
            uVar20 = (ulong)uVar11;
          } while (uVar11 != 4);
          uVar12 = uVar12 + 1;
        } while (uVar12 != 4);
        uVar34 = uVar34 + 1;
      } while (uVar34 != 4);
      uVar40 = uVar40 + 1;
    } while (uVar40 != 5);
    uVar29 = uVar29 + 1;
  } while (uVar29 != 3);
  function_tests = function_tests + 1;
  local_80 = 0;
  uVar29 = 0;
  do {
    puVar28 = &DAT_00152228;
    uVar40 = 0;
    do {
      iVar3 = (int)piVar27;
      iVar2 = xmlMemBlocks();
      pxVar13 = gen_xmlParserCtxtPtr(uVar29,iVar3);
      piVar27 = (int *)0xffffffff;
      if (uVar40 < 3) {
        piVar27 = (int *)(ulong)*puVar28;
      }
      xmlSwitchEncoding(pxVar13);
      call_tests = call_tests + 1;
      if (pxVar13 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar13);
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSwitchEncoding",(ulong)(uint)(iVar3 - iVar2));
        local_80 = local_80 + 1;
        printf(" %d",(ulong)uVar29);
        piVar27 = (int *)(ulong)uVar40;
        printf(" %d");
        putchar(10);
      }
      uVar40 = uVar40 + 1;
      puVar28 = puVar28 + 1;
    } while (uVar40 != 4);
    uVar29 = uVar29 + 1;
  } while (uVar29 != 3);
  local_58 = iVar35 + local_60 + local_5c + local_58;
  function_tests = function_tests + 1;
  iVar35 = 0;
  uVar29 = 0;
  do {
    iVar2 = local_58;
    iVar3 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(uVar29,iVar2);
    xmlSwitchInputEncoding(pxVar13,0,0);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar3 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSwitchInputEncoding",(ulong)(uint)(iVar2 - iVar3));
      iVar35 = iVar35 + 1;
      printf(" %d",(ulong)uVar29);
      printf(" %d",0);
      printf(" %d",0);
      putchar(10);
    }
    uVar29 = uVar29 + 1;
  } while (uVar29 != 3);
  local_58 = local_58 + local_54;
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar29 = 0;
  do {
    iVar3 = local_58;
    iVar4 = xmlMemBlocks();
    pxVar13 = gen_xmlParserCtxtPtr(uVar29,iVar3);
    xmlSwitchToEncoding(pxVar13,0);
    call_tests = call_tests + 1;
    if (pxVar13 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar13);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar4 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSwitchToEncoding",(ulong)(uint)(iVar3 - iVar4));
      iVar2 = iVar2 + 1;
      printf(" %d",(ulong)uVar29);
      printf(" %d",0);
      putchar(10);
    }
    uVar29 = uVar29 + 1;
  } while (uVar29 != 3);
  function_tests = function_tests + 1;
  iVar2 = local_58 + local_80 + iVar35 + iVar2;
  if (iVar2 != 0) {
    printf("Module parserInternals: %d errors\n");
  }
  return iVar2;
}

Assistant:

static int
test_parserInternals(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing parserInternals : 30 of 87 functions ...\n");
    test_ret += test_inputPop();
    test_ret += test_inputPush();
    test_ret += test_namePop();
    test_ret += test_namePush();
    test_ret += test_nodePop();
    test_ret += test_nodePush();
    test_ret += test_xmlCheckLanguageID();
    test_ret += test_xmlCopyChar();
    test_ret += test_xmlCopyCharMultiByte();
    test_ret += test_xmlCreateEntityParserCtxt();
    test_ret += test_xmlCreateFileParserCtxt();
    test_ret += test_xmlCreateMemoryParserCtxt();
    test_ret += test_xmlCreateURLParserCtxt();
    test_ret += test_xmlCurrentChar();
    test_ret += test_xmlIsLetter();
    test_ret += test_xmlNewEntityInputStream();
    test_ret += test_xmlNewInputFromFile();
    test_ret += test_xmlNewInputStream();
    test_ret += test_xmlNewStringInputStream();
    test_ret += test_xmlNextChar();
    test_ret += test_xmlParserInputShrink();
    test_ret += test_xmlPopInput();
    test_ret += test_xmlPushInput();
    test_ret += test_xmlSetEntityReferenceFunc();
    test_ret += test_xmlSplitQName();
    test_ret += test_xmlStringCurrentChar();
    test_ret += test_xmlStringDecodeEntities();
    test_ret += test_xmlStringLenDecodeEntities();
    test_ret += test_xmlSwitchEncoding();
    test_ret += test_xmlSwitchInputEncoding();
    test_ret += test_xmlSwitchToEncoding();

    if (test_ret != 0)
	printf("Module parserInternals: %d errors\n", test_ret);
    return(test_ret);
}